

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O0

io_service * __thiscall cppcms::impl::tcp_cache_service::server::get_next_io_service(server *this)

{
  long lVar1;
  ulong uVar2;
  size_type sVar3;
  reference ppiVar4;
  long in_RDI;
  int id;
  
  lVar1 = *(long *)(in_RDI + 0x30);
  *(long *)(in_RDI + 0x30) = lVar1 + 1;
  uVar2 = *(ulong *)(in_RDI + 0x30);
  sVar3 = std::vector<booster::aio::io_service_*,_std::allocator<booster::aio::io_service_*>_>::size
                    ((vector<booster::aio::io_service_*,_std::allocator<booster::aio::io_service_*>_>
                      *)(in_RDI + 0x40));
  if (sVar3 <= uVar2) {
    *(undefined8 *)(in_RDI + 0x30) = 0;
  }
  ppiVar4 = std::vector<booster::aio::io_service_*,_std::allocator<booster::aio::io_service_*>_>::
            operator[]((vector<booster::aio::io_service_*,_std::allocator<booster::aio::io_service_*>_>
                        *)(in_RDI + 0x40),(long)(int)lVar1);
  return *ppiVar4;
}

Assistant:

io::io_service &get_next_io_service()
	{
		int id = counter++;
		if(counter >= services_.size())
			counter = 0;
		return *services_[id];
	}